

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtipccommon.cpp
# Opt level: O2

QNativeIpcKey * __thiscall
QtIpcCommon::legacyPlatformSafeKey
          (QNativeIpcKey *__return_storage_ptr__,QtIpcCommon *this,QString *key,IpcType ipcType,
          Type type)

{
  QChar ch;
  long lVar1;
  long lVar2;
  Data *pDVar3;
  char16_t *pcVar4;
  qsizetype qVar5;
  char *pcVar6;
  long lVar7;
  undefined2 in_register_00000082;
  Algorithm method;
  QString *__range1;
  long in_FS_OFFSET;
  QLatin1StringView str;
  QLatin1StringView str_00;
  QByteArrayView data;
  qsizetype qStack_120;
  QArrayDataPointer<char16_t> local_108;
  QArrayDataPointer<char16_t> local_e8;
  QArrayDataPointer<char16_t> local_c8;
  QArrayDataPointer<char> local_a8;
  QStringBuilder<QString,_char16_t> local_88;
  QStringBuilder<QStringBuilder<QString,_char16_t>,_QString_&> local_60;
  long local_38;
  
  method = CONCAT22(in_register_00000082,type);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->key).d.ptr = (char16_t *)0x0;
  (__return_storage_ptr__->key).d.size = 0;
  __return_storage_ptr__->d = (QNativeIpcKeyPrivate *)0x0;
  (__return_storage_ptr__->key).d.d = (Data *)0x0;
  (__return_storage_ptr__->typeAndFlags).type = (Type)ipcType;
  (__return_storage_ptr__->typeAndFlags).reserved1 = 0;
  (__return_storage_ptr__->typeAndFlags).reserved2 = 0;
  if (*(long *)(this + 0x10) == 0) goto LAB_0020ae40;
  local_a8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_a8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_a8.ptr = &DAT_aaaaaaaaaaaaaaaa;
  QString::toUtf8_helper((QByteArray *)&local_88,(QString *)this);
  data.m_data = (storage_type *)0x2;
  data.m_size = (qsizetype)local_88.a.d.ptr;
  QCryptographicHash::hash
            ((QByteArray *)&local_60,(QCryptographicHash *)local_88.a.d.size,data,method);
  QByteArray::toHex((QByteArray *)&local_a8,(QByteArray *)&local_60,'\0');
  QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_60);
  QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_88);
  local_c8.size = 0;
  local_c8.d = (Data *)0x0;
  local_c8.ptr = (char16_t *)0x0;
  QString::reserve((QString *)&local_c8,*(long *)(this + 0x10) + 0x3b);
  if ((int)key == 0) {
    pcVar6 = "qipc_sharedmemory_";
    qStack_120 = 0x12;
LAB_0020acdc:
    str.m_data = pcVar6;
    str.m_size = qStack_120;
    QString::append((QString *)&local_c8,str);
  }
  else if ((int)key == 1) {
    pcVar6 = "qipc_systemsem_";
    qStack_120 = 0xf;
    goto LAB_0020acdc;
  }
  lVar1 = *(long *)(this + 8);
  lVar2 = *(long *)(this + 0x10);
  for (lVar7 = 0; lVar2 * 2 != lVar7; lVar7 = lVar7 + 2) {
    ch.ucs = *(char16_t *)(lVar1 + lVar7);
    if ((ushort)ch.ucs < 0x61) {
      if ((ushort)(ch.ucs + L'﾿') < 0x1a) goto LAB_0020ad1e;
    }
    else if ((ushort)ch.ucs < 0x7b) {
LAB_0020ad1e:
      QString::append((QString *)&local_c8,ch);
    }
  }
  str_00.m_data = local_a8.ptr;
  str_00.m_size = local_a8.size;
  QString::append((QString *)&local_c8,str_00);
  if ((Type)ipcType != Windows) {
    if ((ipcType & 0xffff) == 0x100) {
      QString::prepend((QString *)&local_c8,(QChar)0x2f);
    }
    else {
      QStandardPaths::writableLocation((QString *)&local_108,TempLocation);
      local_88.a.d.size = local_108.size;
      local_88.a.d.ptr = local_108.ptr;
      local_88.a.d.d = local_108.d;
      local_108.d = (Data *)0x0;
      local_108.ptr = (char16_t *)0x0;
      local_108.size = 0;
      local_88.b = L'/';
      QStringBuilder<QString,_char16_t>::QStringBuilder(&local_60.a,&local_88);
      local_60.b = (QString *)&local_c8;
      QStringBuilder<QStringBuilder<QString,_char16_t>,_QString_&>::convertTo<QString>
                ((QString *)&local_e8,&local_60);
      qVar5 = local_c8.size;
      pcVar4 = local_c8.ptr;
      pDVar3 = local_c8.d;
      local_c8.d = local_e8.d;
      local_c8.ptr = local_e8.ptr;
      local_e8.d = pDVar3;
      local_e8.ptr = pcVar4;
      local_c8.size = local_e8.size;
      local_e8.size = qVar5;
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_e8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_60);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_88);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_108);
    }
    QNativeIpcKeyPrivate::setNativeAndLegacyKeys
              (__return_storage_ptr__,(QString *)&local_c8,(QString *)this);
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c8);
  QArrayDataPointer<char>::~QArrayDataPointer(&local_a8);
LAB_0020ae40:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QNativeIpcKey QtIpcCommon::legacyPlatformSafeKey(const QString &key, QtIpcCommon::IpcType ipcType,
                                                 QNativeIpcKey::Type type)
{
    QNativeIpcKey k(type);
    if (key.isEmpty())
        return k;

    QByteArray hex = QCryptographicHash::hash(key.toUtf8(), QCryptographicHash::Sha1).toHex();

    if (type == QNativeIpcKey::Type::PosixRealtime) {
#if defined(Q_OS_DARWIN)
        if (qt_apple_isSandboxed()) {
            // Sandboxed applications on Apple platforms require the shared memory name
            // to be in the form <application group identifier>/<custom identifier>.
            // Since we don't know which application group identifier the user wants
            // to apply, we instead document that requirement, and use the key directly.
            QNativeIpcKeyPrivate::setNativeAndLegacyKeys(k, key, key);
        } else {
            // The shared memory name limit on Apple platforms is very low (30 characters),
            // so we can't use the logic below of combining the prefix, key, and a hash,
            // to ensure a unique and valid name. Instead we use the first part of the
            // hash, which should still long enough to avoid collisions in practice.
            QString native = u'/' + QLatin1StringView(hex).left(SHM_NAME_MAX - 1);
            QNativeIpcKeyPrivate::setNativeAndLegacyKeys(k, native, key);
        }
        return k;
#endif
    }

    QString result;
    result.reserve(1 + 18 + key.size() + 40);
    switch (ipcType) {
    case IpcType::SharedMemory:
        result += "qipc_sharedmemory_"_L1;
        break;
    case IpcType::SystemSemaphore:
        result += "qipc_systemsem_"_L1;
        break;
    }

    for (QChar ch : key) {
        if ((ch >= u'a' && ch <= u'z') ||
           (ch >= u'A' && ch <= u'Z'))
           result += ch;
    }
    result.append(QLatin1StringView(hex));

    switch (type) {
    case QNativeIpcKey::Type::Windows:
        if (isIpcSupported(ipcType, QNativeIpcKey::Type::Windows))
            QNativeIpcKeyPrivate::setNativeAndLegacyKeys(k, result, key);
        return k;
    case QNativeIpcKey::Type::PosixRealtime:
        result.prepend(u'/');
        if (isIpcSupported(ipcType, QNativeIpcKey::Type::PosixRealtime))
            QNativeIpcKeyPrivate::setNativeAndLegacyKeys(k, result, key);
        return k;
    case QNativeIpcKey::Type::SystemV:
        break;
    }
    if (isIpcSupported(ipcType, QNativeIpcKey::Type::SystemV)) {
        result = QStandardPaths::writableLocation(QStandardPaths::TempLocation) + u'/' + result;
        QNativeIpcKeyPrivate::setNativeAndLegacyKeys(k, result, key);
    }
    return k;
}